

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O2

void do_objs(char *outfile)

{
  bool bVar1;
  FILE *pFVar2;
  objclass *poVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char cVar8;
  char cVar9;
  uint uVar10;
  char cVar11;
  uint uVar12;
  short sVar13;
  ulong uVar14;
  uint local_40;
  int local_3c;
  
  ofp = (FILE *)fopen(outfile,"w+");
  if ((FILE *)ofp == (FILE *)0x0) {
    perror(outfile);
  }
  else {
    fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
    fwrite("#ifndef ONAMES_H\n#define ONAMES_H\n\n",0x23,1,(FILE *)ofp);
    uVar12 = 0;
    local_3c = 0;
    cVar11 = '\0';
    bVar1 = false;
    for (uVar14 = 0;
        (poVar3 = objects, uVar10 = (uint)cVar11, uVar14 == 0 ||
        (objects[uVar14].oc_class != '\x01')); uVar14 = uVar14 + 1) {
      sVar13 = (short)uVar14;
      objects[uVar14].oc_descr_idx = sVar13;
      poVar3[uVar14].oc_name_idx = sVar13;
      pcVar6 = tmpdup(obj_descr[sVar13].oc_name);
      if (pcVar6 != (char *)0x0) {
        cVar9 = objects[uVar14].oc_class;
        pcVar7 = pcVar6;
        local_40 = uVar12;
        if (((cVar9 != cVar11) && (local_40 = 0, cVar11 = cVar9, uVar12 != 0)) && (uVar12 != 1000))
        {
          local_40 = 0;
          fprintf(_stderr,"prob error for class %d (%d%%)",(ulong)uVar10,(ulong)uVar12);
          fflush(_stderr);
          bVar1 = true;
          cVar11 = objects[uVar14].oc_class;
        }
        for (; cVar9 = *pcVar7, cVar9 != '\0'; pcVar7 = pcVar7 + 1) {
          if ((byte)(cVar9 + 0x9fU) < 0x1a) {
            cVar8 = cVar9 + -0x20;
LAB_00109666:
            *pcVar7 = cVar8;
          }
          else {
            cVar8 = '_';
            if ((byte)(cVar9 + 0xa5U) < 0xe6) goto LAB_00109666;
          }
        }
        switch(cVar11) {
        case '\x04':
          pcVar7 = "#define\tRIN_";
          break;
        case '\x05':
          fwrite("#define\t",8,1,(FILE *)ofp);
          iVar4 = 0;
          if ((*(ushort *)&objects[uVar14].field_0x11 & 0x1f0) != 0x120) goto LAB_00109728;
          fprintf((FILE *)ofp,"FAKE_AMULET_OF_YENDOR\t%d\n",uVar14 & 0xffffffff);
          goto LAB_00109752;
        default:
          fwrite("#define\t",8,1,(FILE *)ofp);
          iVar4 = 0;
          goto LAB_00109728;
        case '\b':
          pcVar7 = "#define\tPOT_";
          break;
        case '\t':
          pcVar7 = "#define\tSCR_";
          break;
        case '\n':
          fwrite("#define\tSPE_",0xc,1,(FILE *)ofp);
          local_3c = local_3c + 1;
          goto LAB_00109720;
        case '\v':
          pcVar7 = "#define\tWAN_";
        }
        fwrite(pcVar7,0xc,1,(FILE *)ofp);
LAB_00109720:
        iVar4 = 1;
LAB_00109728:
        pFVar2 = ofp;
        limit(pcVar6,iVar4);
        fprintf((FILE *)pFVar2,"%s\t%d\n",temp,uVar14 & 0xffffffff);
LAB_00109752:
        uVar12 = local_40 + (int)objects[uVar14].oc_prob;
      }
    }
    if ((uVar12 != 0) && (uVar12 != 1000)) {
      fprintf(_stderr,"prob error for class %d (%d%%)",(ulong)uVar10,(ulong)uVar12);
      fflush(_stderr);
      bVar1 = true;
    }
    fwrite("#define\tLAST_GEM\t(JADE)\n",0x18,1,(FILE *)ofp);
    fprintf((FILE *)ofp,"#define\tMAXSPELL\t%d\n",(ulong)(local_3c + 1));
    fprintf((FILE *)ofp,"#define\tNUM_OBJECTS\t%d\n",uVar14 & 0xffffffff);
    fwrite("\n/* Artifacts (unique objects) */\n\n",0x23,1,(FILE *)ofp);
    for (uVar14 = 1; uVar14 != 0x25; uVar14 = uVar14 + 1) {
      pcVar7 = tmpdup(artifact_names[uVar14]);
      for (pcVar6 = pcVar7; cVar11 = *pcVar6, cVar11 != '\0'; pcVar6 = pcVar6 + 1) {
        if ((byte)(cVar11 + 0x9fU) < 0x1a) {
          cVar9 = cVar11 + -0x20;
LAB_00109888:
          *pcVar6 = cVar9;
        }
        else {
          cVar9 = '_';
          if ((byte)(cVar11 + 0xa5U) < 0xe6) goto LAB_00109888;
        }
      }
      iVar4 = strncmp(pcVar7,"THE_",4);
      iVar5 = strncmp(pcVar7 + (ulong)(iVar4 == 0) * 4,"PLATINUM_",9);
      pFVar2 = ofp;
      limit(pcVar7 + (ulong)(iVar4 == 0) * 4 + (ulong)(iVar5 == 0) * 9,1);
      fprintf((FILE *)pFVar2,"#define\tART_%s\t%d\n",temp,uVar14 & 0xffffffff);
    }
    fprintf((FILE *)ofp,"#define\tNROFARTIFACTS\t%d\n",0x24);
    fwrite("\n#endif /* ONAMES_H */\n",0x17,1,(FILE *)ofp);
    fclose((FILE *)ofp);
    if (!bVar1) {
      return;
    }
  }
  exit(1);
}

Assistant:

void do_objs(const char *outfile)
{
	int i, sum = 0;
	char *c, *objnam;
	int nspell = 0;
	int prefix = 0;
	char class = '\0';
	boolean	sumerr = FALSE;

	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		exit(EXIT_FAILURE);
	}
	
	fprintf(ofp,"%s",Dont_Edit_Code);
	fprintf(ofp,"#ifndef ONAMES_H\n#define ONAMES_H\n\n");

	for (i = 0; !i || objects[i].oc_class != ILLOBJ_CLASS; i++) {
		objects[i].oc_name_idx = objects[i].oc_descr_idx = i;	/* init */
		if (!(objnam = tmpdup(OBJ_NAME(objects[i])))) continue;

		/* make sure probabilities add up to 1000 */
		if (objects[i].oc_class != class) {
			if (sum && sum != 1000) {
			    fprintf(stderr, "prob error for class %d (%d%%)",
				    class, sum);
			    fflush(stderr);
			    sumerr = TRUE;
			}
			class = objects[i].oc_class;
			sum = 0;
		}

		for (c = objnam; *c; c++)
		    if (*c >= 'a' && *c <= 'z') *c -= (char)('a' - 'A');
		    else if (*c < 'A' || *c > 'Z') *c = '_';

		switch (class) {
		    case WAND_CLASS:
			fprintf(ofp,"#define\tWAN_"); prefix = 1; break;
		    case RING_CLASS:
			fprintf(ofp,"#define\tRIN_"); prefix = 1; break;
		    case POTION_CLASS:
			fprintf(ofp,"#define\tPOT_"); prefix = 1; break;
		    case SPBOOK_CLASS:
			fprintf(ofp,"#define\tSPE_"); prefix = 1; nspell++; break;
		    case SCROLL_CLASS:
			fprintf(ofp,"#define\tSCR_"); prefix = 1; break;
		    case AMULET_CLASS:
			/* avoid trouble with stupid C preprocessors */
			fprintf(ofp,"#define\t");
			if (objects[i].oc_material == PLASTIC) {
			    fprintf(ofp,"FAKE_AMULET_OF_YENDOR\t%d\n", i);
			    prefix = -1;
			    break;
			}
			break;
		    default:
			fprintf(ofp,"#define\t");
		}
		if (prefix >= 0)
			fprintf(ofp,"%s\t%d\n", limit(objnam, prefix), i);
		prefix = 0;

		sum += objects[i].oc_prob;
	}

	/* check last set of probabilities */
	if (sum && sum != 1000) {
	    fprintf(stderr, "prob error for class %d (%d%%)", class, sum);
	    fflush(stderr);
	    sumerr = TRUE;
	}

	fprintf(ofp,"#define\tLAST_GEM\t(JADE)\n");
	fprintf(ofp,"#define\tMAXSPELL\t%d\n", nspell+1);
	fprintf(ofp,"#define\tNUM_OBJECTS\t%d\n", i);

	fprintf(ofp, "\n/* Artifacts (unique objects) */\n\n");

	for (i = 1; artifact_names[i]; i++) {
		for (c = objnam = tmpdup(artifact_names[i]); *c; c++)
		    if (*c >= 'a' && *c <= 'z') *c -= (char)('a' - 'A');
		    else if (*c < 'A' || *c > 'Z') *c = '_';

		if (!strncmp(objnam, "THE_", 4))
			objnam += 4;
		/* fudge _platinum_ YENDORIAN EXPRESS CARD */
		if (!strncmp(objnam, "PLATINUM_", 9))
			objnam += 9;
		fprintf(ofp,"#define\tART_%s\t%d\n", limit(objnam, 1), i);
	}

	fprintf(ofp, "#define\tNROFARTIFACTS\t%d\n", i-1);
	fprintf(ofp,"\n#endif /* ONAMES_H */\n");
	fclose(ofp);
	if (sumerr) exit(EXIT_FAILURE);
	return;
}